

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_soft_max::build_graph(test_soft_max *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  const_reference pvVar2;
  size_type in_RSI;
  test_case *in_RDI;
  ggml_tensor *out;
  ggml_tensor *mask;
  ggml_tensor *a;
  size_type sVar3;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  int64_t *in_stack_ffffffffffffffb8;
  value_type_conflict3 ne0;
  ggml_type type;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  ggml_tensor *local_20;
  
  uVar5 = *(undefined4 *)&in_RDI[1]._vptr_test_case;
  sVar3 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x15d2f2);
  pgVar1 = test_case::ggml_new_tensor
                     (in_RDI,(ggml_context *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                      (ggml_type)(sVar3 >> 0x20),(int)sVar3,in_stack_ffffffffffffffb8);
  type = (ggml_type)(sVar3 >> 0x20);
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"a");
  local_20 = (ggml_tensor *)0x0;
  if (((ulong)in_RDI[1].sentinels.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
    uVar4 = *(undefined4 *)
             ((long)&in_RDI[1].sentinels.
                     super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
    sVar3 = in_RSI;
    pvVar2 = std::array<long,_4UL>::operator[]
                       ((array<long,_4UL> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),in_RSI);
    ne0 = *pvVar2;
    std::array<long,_4UL>::operator[]
              ((array<long,_4UL> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),sVar3);
    local_20 = test_case::ggml_new_tensor_2d
                         (in_RDI,(ggml_context *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),type,ne0,
                          CONCAT44(uVar4,in_stack_ffffffffffffffb0));
    ggml_set_name(local_20,"mask");
  }
  pgVar1 = (ggml_tensor *)
           ggml_soft_max_ext(*(undefined4 *)
                              &in_RDI[1].sentinels.
                               super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                             *(undefined4 *)
                              ((long)&in_RDI[1].sentinels.
                                      super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),in_RSI
                             ,pgVar1,local_20);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * mask = nullptr;
        if (this->mask) {
            mask = ggml_new_tensor_2d(ctx, m_prec, ne[0], ne[1]);
            ggml_set_name(mask, "mask");
        }

        ggml_tensor * out = ggml_soft_max_ext(ctx, a, mask, scale, max_bias);
        ggml_set_name(out, "out");

        return out;
    }